

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
optional_mark_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (optional_mark_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<true>>
           *this,long state,long *next)

{
  undefined1 uVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  
  cVar3 = (**(code **)(**(long **)this + 0x10))();
  cVar4 = '\x01';
  if (cVar3 == '\0') {
    lVar5 = (long)*(int *)(this + 8);
    lVar2 = *(long *)(state + 8);
    uVar1 = *(undefined1 *)(lVar2 + 0x10 + lVar5 * 0x28);
    *(undefined1 *)(lVar2 + 0x10 + lVar5 * 0x28) = 0;
    cVar4 = (**(code **)(*next + 0x10))(next,state);
    if (cVar4 == '\0') {
      *(undefined1 *)(lVar2 + lVar5 * 0x28 + 0x10) = uVar1;
    }
  }
  return (bool)cVar4;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::true_) const // Greedy
        {
            return this->xpr_.BOOST_NESTED_TEMPLATE push_match<Next>(state)
                || match_next(state, next, this->mark_number_);
        }